

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O1

bool __thiscall
OpenMesh::IO::_PLYReader_::read_ascii
          (_PLYReader_ *this,istream *_in,BaseImporter *_bi,Options *_opt)

{
  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  *this_00;
  bool bVar1;
  VertexHandle _vh;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  mostream *pmVar4;
  uint uVar5;
  int *piVar6;
  _PLYReader_ *this_01;
  float fVar7;
  int local_e0;
  int local_dc;
  uint k;
  uint l;
  uint idx;
  Vec3f v;
  Vec3f n;
  Vec2f t;
  undefined1 auStack_a8 [8];
  VHandles vhandles;
  size_type *local_80;
  string trash;
  int iStack_58;
  Vec4i c;
  uint nV;
  uint local_40;
  float local_3c;
  float local_38;
  float tmp;
  
  vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_opt;
  bVar1 = can_u_read(this,_in);
  if (bVar1) {
    local_80 = &trash._M_string_length;
    trash._M_dataplus._M_p = (pointer)0x0;
    trash._M_string_length._0_1_ = 0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unique0x100007e9 = _bi;
    (*_bi->_vptr_BaseImporter[0x1b])(_bi,(ulong)this->vertexCount_,(ulong)(this->vertexCount_ * 3));
    bVar1 = this->vertexDimension_ == 3;
    if (bVar1) {
      if (this->vertexCount_ != 0) {
        this_00 = &this->vertexPropertyMap_;
        uVar5 = 0;
        do {
          if (((byte)_in[*(long *)(*(long *)_in + -0x18) + 0x20] & 2) != 0) break;
          _vh.super_BaseHandle.idx_ =
               (BaseHandle)(*stack0xffffffffffffffb8->_vptr_BaseImporter[3])();
          _l = 0;
          v.super_VectorDataT<float,_3>.values_[0] = 0.0;
          v.super_VectorDataT<float,_3>.values_[1] = 0.0;
          v.super_VectorDataT<float,_3>.values_[2] = 0.0;
          n.super_VectorDataT<float,_3>.values_[0] = 0.0;
          n.super_VectorDataT<float,_3>.values_[1] = 0.0;
          n.super_VectorDataT<float,_3>.values_[2] = 0.0;
          trash.field_2._12_4_ = 0;
          iStack_58 = 0;
          c.super_VectorDataT<int,_4>.values_[0] = 0;
          c.super_VectorDataT<int,_4>.values_[1] = 0xff;
          if (this->vertexPropertyCount_ != 0) {
            fVar7 = 0.0;
            do {
              tmp = fVar7;
              pmVar2 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](this_00,(key_type *)&tmp);
              switch(pmVar2->property) {
              case XCOORD:
                break;
              case YCOORD:
                break;
              case ZCOORD:
                break;
              case TEXX:
                break;
              case TEXY:
                break;
              case COLORRED:
                tmp = fVar7;
                pmVar2 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,(key_type *)&tmp);
                if (pmVar2->value != ValueTypeFLOAT32) {
                  local_38 = fVar7;
                  pmVar2 = std::
                           map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                           ::operator[](this_00,(key_type *)&local_38);
                  piVar6 = (int *)(trash.field_2._M_local_buf + 0xc);
                  if (pmVar2->value != ValueTypeFLOAT) {
LAB_0017b25b:
                    std::istream::operator>>(_in,piVar6);
                    goto LAB_0017b1f7;
                  }
                }
                std::istream::_M_extract<float>((float *)_in);
                trash.field_2._12_4_ = (undefined4)(local_3c * 255.0);
                goto LAB_0017b1f7;
              case COLORGREEN:
                tmp = fVar7;
                pmVar2 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,(key_type *)&tmp);
                if (pmVar2->value != ValueTypeFLOAT32) {
                  local_38 = fVar7;
                  pmVar2 = std::
                           map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                           ::operator[](this_00,(key_type *)&local_38);
                  piVar6 = &iStack_58;
                  if (pmVar2->value != ValueTypeFLOAT) goto LAB_0017b25b;
                }
                std::istream::_M_extract<float>((float *)_in);
                iStack_58 = (int)(local_3c * 255.0);
                goto LAB_0017b1f7;
              case COLORBLUE:
                tmp = fVar7;
                pmVar2 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,(key_type *)&tmp);
                if (pmVar2->value != ValueTypeFLOAT32) {
                  local_38 = fVar7;
                  pmVar2 = std::
                           map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                           ::operator[](this_00,(key_type *)&local_38);
                  piVar6 = (int *)&c;
                  if (pmVar2->value != ValueTypeFLOAT) goto LAB_0017b25b;
                }
                std::istream::_M_extract<float>((float *)_in);
                c.super_VectorDataT<int,_4>.values_[0] = (int)(local_3c * 255.0);
                goto LAB_0017b1f7;
              case COLORALPHA:
                tmp = fVar7;
                pmVar2 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,(key_type *)&tmp);
                if (pmVar2->value != ValueTypeFLOAT32) {
                  local_38 = fVar7;
                  pmVar2 = std::
                           map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                           ::operator[](this_00,(key_type *)&local_38);
                  piVar6 = c.super_VectorDataT<int,_4>.values_ + 1;
                  if (pmVar2->value != ValueTypeFLOAT) goto LAB_0017b25b;
                }
                std::istream::_M_extract<float>((float *)_in);
                c.super_VectorDataT<int,_4>.values_[1] = (int)(local_3c * 255.0);
                goto LAB_0017b1f7;
              case XNORM:
                break;
              case YNORM:
                break;
              case ZNORM:
                break;
              case CUSTOM_PROP:
                if ((((vhandles.
                       super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_BaseHandle).idx_ &
                    0x2000) == 0) goto LAB_0017b0ae;
                tmp = fVar7;
                pmVar2 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,(key_type *)&tmp);
                this_01 = (_PLYReader_ *)this_00;
                local_38 = fVar7;
                pmVar3 = std::
                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                         ::operator[](this_00,(key_type *)&local_38);
                readCustomProperty(this_01,_in,stack0xffffffffffffffb8,_vh,&pmVar2->name,
                                   pmVar3->value);
                goto LAB_0017b1f7;
              default:
LAB_0017b0ae:
                std::operator>>(_in,(string *)&local_80);
                goto LAB_0017b1f7;
              }
              std::istream::_M_extract<float>((float *)_in);
LAB_0017b1f7:
              fVar7 = (float)((int)fVar7 + 1);
            } while ((uint)fVar7 < this->vertexPropertyCount_);
          }
          (*stack0xffffffffffffffb8->_vptr_BaseImporter[7])
                    (stack0xffffffffffffffb8,(ulong)(uint)_vh.super_BaseHandle.idx_,&l);
          if ((((vhandles.
                 super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_BaseHandle).idx_ & 0x10)
              != 0) {
            (*stack0xffffffffffffffb8->_vptr_BaseImporter[8])
                      (stack0xffffffffffffffb8,(ulong)(uint)_vh.super_BaseHandle.idx_,
                       v.super_VectorDataT<float,_3>.values_ + 1);
          }
          if ((((vhandles.
                 super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_BaseHandle).idx_ & 0x40)
              != 0) {
            (*stack0xffffffffffffffb8->_vptr_BaseImporter[0xd])
                      (stack0xffffffffffffffb8,(ulong)(uint)_vh.super_BaseHandle.idx_,
                       n.super_VectorDataT<float,_3>.values_ + 1);
          }
          if ((((vhandles.
                 super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_BaseHandle).idx_ & 0x20)
              != 0) {
            tmp = (float)CONCAT13((undefined1)c.super_VectorDataT<int,_4>.values_[1],
                                  CONCAT12((undefined1)c.super_VectorDataT<int,_4>.values_[0],
                                           CONCAT11((undefined1)iStack_58,(char)trash.field_2._12_4_
                                                   )));
            (*stack0xffffffffffffffb8->_vptr_BaseImporter[10])
                      (stack0xffffffffffffffb8,(ulong)(uint)_vh.super_BaseHandle.idx_,&tmp);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < this->vertexCount_);
      }
      if (this->faceCount_ != 0) {
        uVar5 = 0;
        do {
          std::istream::_M_extract<unsigned_int>((uint *)_in);
          if (c.super_VectorDataT<int,_4>.values_[2] == 3) {
            std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                      ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                       auStack_a8,3);
            std::istream::_M_extract<unsigned_int>((uint *)_in);
            std::istream::_M_extract<unsigned_int>((uint *)_in);
            std::istream::_M_extract<unsigned_int>((uint *)_in);
            ((BaseHandle *)auStack_a8)->idx_ = local_40;
            (((pointer)((long)auStack_a8 + 4))->super_BaseHandle).idx_ = local_e0;
            (((pointer)((long)auStack_a8 + 8))->super_BaseHandle).idx_ = local_dc;
          }
          else {
            if ((undefined1  [8])
                vhandles.
                super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
                _M_impl.super__Vector_impl_data._M_start != auStack_a8) {
              vhandles.
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_a8;
            }
            local_40 = 0;
            if (c.super_VectorDataT<int,_4>.values_[2] != 0) {
              do {
                std::istream::_M_extract<unsigned_int>((uint *)_in);
                tmp = (float)k;
                if (vhandles.
                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    vhandles.
                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                  _M_realloc_insert<OpenMesh::VertexHandle>
                            ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                              *)auStack_a8,
                             (iterator)
                             vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_start,(VertexHandle *)&tmp);
                }
                else {
                  ((vhandles.
                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = k;
                  vhandles.
                  super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       vhandles.
                       super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1;
                }
                local_40 = local_40 + 1;
              } while (local_40 < (uint)c.super_VectorDataT<int,_4>.values_[2]);
            }
          }
          (*stack0xffffffffffffffb8->_vptr_BaseImporter[4])
                    (stack0xffffffffffffffb8,
                     (vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                     auStack_a8);
          uVar5 = uVar5 + 1;
        } while (uVar5 < this->faceCount_);
      }
    }
    else {
      pmVar4 = omerr();
      std::__ostream_insert<char,std::char_traits<char>>
                (&pmVar4->super_ostream,"[PLYReader] : Only vertex dimension 3 is supported.",0x33);
      std::ios::widen((char)(pmVar4->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar4);
      std::ostream::put((char)pmVar4);
      std::ostream::flush();
    }
    if (auStack_a8 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_a8);
    }
    if (local_80 != &trash._M_string_length) {
      operator_delete(local_80);
    }
  }
  else {
    pmVar4 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar4->super_ostream,"[PLYReader] : Unable to parse header\n",0x25);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool _PLYReader_::read_ascii(std::istream& _in, BaseImporter& _bi, const Options& _opt) const {

    // Reparse the header
    if (!can_u_read(_in)) {
        omerr() << "[PLYReader] : Unable to parse header\n";
        return false;
    }

    unsigned int i, j, k, l, idx;
    unsigned int nV;
    OpenMesh::Vec3f v, n;
    std::string trash;
    OpenMesh::Vec2f t;
    OpenMesh::Vec4i c;
    float tmp;
    BaseImporter::VHandles vhandles;
    VertexHandle vh;

    _bi.reserve(vertexCount_, 3* vertexCount_ , faceCount_);

    if (vertexDimension_ != 3) {
        omerr() << "[PLYReader] : Only vertex dimension 3 is supported." << std::endl;
        return false;
    }

    // read vertices:
    for (i = 0; i < vertexCount_ && !_in.eof(); ++i) {
        vh = _bi.add_vertex();

        v[0] = 0.0;
        v[1] = 0.0;
        v[2] = 0.0;

        n[0] = 0.0;
        n[1] = 0.0;
        n[2] = 0.0;

        t[0] = 0.0;
        t[1] = 0.0;

        c[0] = 0;
        c[1] = 0;
        c[2] = 0;
        c[3] = 255;

        for (uint propertyIndex = 0; propertyIndex < vertexPropertyCount_; ++propertyIndex) {
            switch (vertexPropertyMap_[propertyIndex].property) {
            case XCOORD:
                _in >> v[0];
                break;
            case YCOORD:
                _in >> v[1];
                break;
            case ZCOORD:
                _in >> v[2];
                break;
            case XNORM:
                _in >> n[0];
                break;
            case YNORM:
                _in >> n[1];
                break;
            case ZNORM:
                _in >> n[2];
                break;
            case TEXX:
                _in >> t[0];
                break;
            case TEXY:
                _in >> t[1];
                break;
            case COLORRED:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[0] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[0];
                break;
            case COLORGREEN:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[1] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[1];
                break;
            case COLORBLUE:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[2] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[2];
                break;
            case COLORALPHA:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[3] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[3];
                break;
            case CUSTOM_PROP:
                if (_opt.check(Options::Custom))
                  readCustomProperty(_in, _bi, vh, vertexPropertyMap_[propertyIndex].name, vertexPropertyMap_[propertyIndex].value);
                else
                  _in >> trash;
                break;
            default:
                _in >> trash;
                break;
            }
        }

        _bi.set_point(vh, v);
        if (_opt.vertex_has_normal())
          _bi.set_normal(vh, n);
        if (_opt.vertex_has_texcoord())
          _bi.set_texcoord(vh, t);
        if (_opt.vertex_has_color())
          _bi.set_color(vh, Vec4uc(c));
    }

    // faces
    // #N <v1> <v2> .. <v(n-1)> [color spec]
    for (i = 0; i < faceCount_; ++i) {
        // nV = number of Vertices for current face
        _in >> nV;

        if (nV == 3) {
            vhandles.resize(3);
            _in >> j;
            _in >> k;
            _in >> l;

            vhandles[0] = VertexHandle(j);
            vhandles[1] = VertexHandle(k);
            vhandles[2] = VertexHandle(l);
        } else {
            vhandles.clear();
            for (j = 0; j < nV; ++j) {
                _in >> idx;
                vhandles.push_back(VertexHandle(idx));
            }
        }

        _bi.add_face(vhandles);

    }

    // File was successfully parsed.
    return true;
}